

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O0

void __thiscall mpt::source<double>::source(source<double> *this,double *val,long len,int step)

{
  long local_50;
  int local_48;
  int type;
  int step_local;
  long len_local;
  double *val_local;
  source<double> *this_local;
  
  iterator::iterator(&this->super_iterator);
  span<const_double>::span(&this->super_span<const_double>,val,len);
  (this->super_iterator)._vptr_iterator = (_func_int **)&PTR_value_00104c70;
  mpt::value::value(&this->_val);
  this->_step = step;
  local_48 = type_properties<double>::id(true);
  if (local_48 < 0) {
    local_48 = 0;
  }
  this->_type = local_48;
  if (step < 0) {
    local_50 = len + -1;
  }
  else {
    local_50 = 0;
  }
  this->_pos = local_50;
  return;
}

Assistant:

source(const T *val, long len = 1, int step = 1) : span<const T>(val, len), _step(step)
	{
		int type = type_properties<T>::id(true);
		_type = type < 0 ? 0 : type;
		_pos = (step < 0) ? len - 1 : 0;
	}